

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O0

optional<pbrt::SquareMatrix<4>_> * __thiscall
pstd::optional<pbrt::SquareMatrix<4>_>::operator=
          (optional<pbrt::SquareMatrix<4>_> *this,optional<pbrt::SquareMatrix<4>_> *v)

{
  bool bVar1;
  optional<pbrt::SquareMatrix<4>_> *this_00;
  SquareMatrix<4> *__src;
  optional<pbrt::SquareMatrix<4>_> *in_RSI;
  optional<pbrt::SquareMatrix<4>_> *in_RDI;
  optional<pbrt::SquareMatrix<4>_> *in_stack_ffffffffffffffe0;
  
  reset(in_stack_ffffffffffffffe0);
  bVar1 = has_value(in_RSI);
  if (bVar1) {
    this_00 = (optional<pbrt::SquareMatrix<4>_> *)ptr((optional<pbrt::SquareMatrix<4>_> *)0x64ff07);
    __src = value(this_00);
    memcpy(this_00,__src,0x40);
    in_RDI->set = true;
    reset(this_00);
  }
  return in_RDI;
}

Assistant:

PBRT_CPU_GPU
    optional &operator=(optional &&v) {
        reset();
        if (v.has_value()) {
            new (ptr()) T(std::move(v.value()));
            set = true;
            v.reset();
        }
        return *this;
    }